

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertion_tests.cpp
# Opt level: O1

void __thiscall
iu_AssertionTest_x_iutest_x_Same_Test::Body(iu_AssertionTest_x_iutest_x_Same_Test *this)

{
  return;
}

Assistant:

IUTEST(AssertionTest, Same)
{
    int v = 0;
    int* p1 = &v;
    IUTEST_ASSERT_SAME(v, *p1);
    IUTEST_EXPECT_SAME(v, *p1);
    IUTEST_INFORM_SAME(v, *p1);
}